

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersector1<4,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  Geometry *this;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 (*pauVar18) [16];
  bool bVar19;
  bool bVar20;
  AABBNodeMB4D *node1;
  ulong uVar21;
  uint uVar22;
  byte bVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  long lVar26;
  size_t i;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  long local_1030;
  long local_1028;
  ulong local_1020;
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [16];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_1048 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    local_1048 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  }
  pauVar24 = (undefined1 (*) [16])local_f68;
  uVar1 = *(undefined4 *)&(query->p).field_0;
  local_f98._4_4_ = uVar1;
  local_f98._0_4_ = uVar1;
  local_f98._8_4_ = uVar1;
  local_f98._12_4_ = uVar1;
  auVar55 = ZEXT1664(local_f98);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_fa8._4_4_ = uVar1;
  local_fa8._0_4_ = uVar1;
  local_fa8._8_4_ = uVar1;
  local_fa8._12_4_ = uVar1;
  auVar56 = ZEXT1664(local_fa8);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_fb8._4_4_ = uVar1;
  local_fb8._0_4_ = uVar1;
  local_fb8._8_4_ = uVar1;
  local_fb8._12_4_ = uVar1;
  auVar57 = ZEXT1664(local_fb8);
  uVar1 = *(undefined4 *)&(context->query_radius).field_0;
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar32._4_4_ = uVar1;
  auVar32._0_4_ = uVar1;
  auVar32._8_4_ = uVar1;
  auVar32._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  bVar20 = false;
  do {
    local_fc8 = vsubps_avx(auVar55._0_16_,auVar34);
    fVar6 = auVar34._0_4_;
    fVar7 = auVar34._4_4_;
    fVar8 = auVar34._8_4_;
    fVar9 = auVar34._12_4_;
    local_fd8 = auVar55._0_4_ + fVar6;
    fStack_fd4 = auVar55._4_4_ + fVar7;
    fStack_fd0 = auVar55._8_4_ + fVar8;
    fStack_fcc = auVar55._12_4_ + fVar9;
    local_fe8 = vsubps_avx(auVar56._0_16_,auVar32);
    local_ff8 = auVar56._0_4_ + auVar32._0_4_;
    fStack_ff4 = auVar56._4_4_ + auVar32._4_4_;
    fStack_ff0 = auVar56._8_4_ + auVar32._8_4_;
    fStack_fec = auVar56._12_4_ + auVar32._12_4_;
    local_1008 = vsubps_avx(auVar57._0_16_,auVar52);
    local_1018._0_4_ = auVar57._0_4_ + auVar52._0_4_;
    local_1018._4_4_ = auVar57._4_4_ + auVar52._4_4_;
    local_1018._8_4_ = auVar57._8_4_ + auVar52._8_4_;
    local_1018._12_4_ = auVar57._12_4_ + auVar52._12_4_;
    local_f88._0_4_ = fVar6 * fVar6;
    local_f88._4_4_ = fVar7 * fVar7;
    local_f88._8_4_ = fVar8 * fVar8;
    local_f88._12_4_ = fVar9 * fVar9;
    auVar58 = ZEXT1664(local_f88);
LAB_01bdcf1a:
    do {
      do {
        if (pauVar24 == (undefined1 (*) [16])&local_f78) {
          return bVar20;
        }
        pauVar18 = pauVar24 + -1;
        pauVar24 = pauVar24 + -1;
      } while ((float)local_1048._0_4_ < *(float *)((long)*pauVar18 + 8));
      uVar29 = *(ulong *)*pauVar24;
LAB_01bdcf3a:
      uVar22 = (uint)uVar29;
      auVar34 = auVar55._0_16_;
      auVar32 = auVar56._0_16_;
      auVar52 = auVar57._0_16_;
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((uVar29 & 8) != 0) goto LAB_01bdd389;
        uVar25 = uVar29 & 0xfffffffffffffff0;
        fVar6 = query->time;
        auVar48._4_4_ = fVar6;
        auVar48._0_4_ = fVar6;
        auVar48._8_4_ = fVar6;
        auVar48._12_4_ = fVar6;
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80),auVar48,
                                  *(undefined1 (*) [16])(uVar25 + 0x20));
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0xa0),auVar48,
                                  *(undefined1 (*) [16])(uVar25 + 0x40));
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0xc0),auVar48,
                                  *(undefined1 (*) [16])(uVar25 + 0x60));
        auVar17 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x90),auVar48,
                                  *(undefined1 (*) [16])(uVar25 + 0x30));
        auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0xb0),auVar48,
                                  *(undefined1 (*) [16])(uVar25 + 0x50));
        auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0xd0),auVar48,
                                  *(undefined1 (*) [16])(uVar25 + 0x70));
        auVar30 = vmaxps_avx(auVar34,auVar49);
        auVar30 = vminps_avx(auVar30,auVar17);
        auVar30 = vsubps_avx(auVar30,auVar34);
        auVar34 = vmaxps_avx(auVar32,auVar50);
        auVar34 = vminps_avx(auVar34,auVar38);
        auVar32 = vsubps_avx(auVar34,auVar32);
        auVar34 = vmaxps_avx(auVar52,auVar51);
        auVar34 = vminps_avx(auVar34,auVar39);
        auVar34 = vsubps_avx(auVar34,auVar52);
        local_1058._4_4_ =
             auVar34._4_4_ * auVar34._4_4_ +
             auVar32._4_4_ * auVar32._4_4_ + auVar30._4_4_ * auVar30._4_4_;
        local_1058._0_4_ =
             auVar34._0_4_ * auVar34._0_4_ +
             auVar32._0_4_ * auVar32._0_4_ + auVar30._0_4_ * auVar30._0_4_;
        fStack_1050 = auVar34._8_4_ * auVar34._8_4_ +
                      auVar32._8_4_ * auVar32._8_4_ + auVar30._8_4_ * auVar30._8_4_;
        fStack_104c = auVar34._12_4_ * auVar34._12_4_ +
                      auVar32._12_4_ * auVar32._12_4_ + auVar30._12_4_ * auVar30._12_4_;
        uVar15 = vcmpps_avx512vl(auVar49,auVar17,2);
        uVar16 = vcmpps_avx512vl(auVar17,local_fc8,1);
        auVar17._4_4_ = fStack_fd4;
        auVar17._0_4_ = local_fd8;
        auVar17._8_4_ = fStack_fd0;
        auVar17._12_4_ = fStack_fcc;
        uVar10 = vcmpps_avx512vl(auVar49,auVar17,6);
        uVar11 = vcmpps_avx512vl(auVar38,local_fe8,1);
        auVar30._4_4_ = fStack_ff4;
        auVar30._0_4_ = local_ff8;
        auVar30._8_4_ = fStack_ff0;
        auVar30._12_4_ = fStack_fec;
        uVar12 = vcmpps_avx512vl(auVar50,auVar30,6);
        uVar13 = vcmpps_avx512vl(auVar39,local_1008,1);
        uVar14 = vcmpps_avx512vl(auVar51,local_1018,6);
        bVar23 = ~((byte)uVar12 | (byte)uVar10 | (byte)uVar14 | (byte)uVar16 | (byte)uVar11 |
                  (byte)uVar13) & (byte)uVar15;
        uVar28 = (ulong)bVar23;
        if ((uVar22 & 7) == 6) {
          uVar15 = vcmpps_avx512vl(auVar48,*(undefined1 (*) [16])(uVar25 + 0xf0),1);
          uVar16 = vcmpps_avx512vl(auVar48,*(undefined1 (*) [16])(uVar25 + 0xe0),0xd);
          uVar28 = (ulong)(bVar23 & (byte)uVar15 & (byte)uVar16);
        }
LAB_01bdd011:
        if ((char)uVar28 != '\0') {
          uVar25 = uVar29 & 0xfffffffffffffff0;
          lVar26 = 0;
          for (uVar29 = uVar28; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
            lVar26 = lVar26 + 1;
          }
          uVar29 = *(ulong *)(uVar25 + lVar26 * 8);
          uVar22 = (uint)uVar28 - 1 & (uint)uVar28;
          uVar28 = (ulong)uVar22;
          if (uVar22 != 0) {
            uVar3 = *(uint *)(local_1058 + lVar26 * 4);
            lVar26 = 0;
            for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
              lVar26 = lVar26 + 1;
            }
            uVar22 = uVar22 - 1 & uVar22;
            uVar21 = (ulong)uVar22;
            uVar28 = *(ulong *)(uVar25 + lVar26 * 8);
            uVar4 = *(uint *)(local_1058 + lVar26 * 4);
            if (uVar22 == 0) {
              if (uVar3 < uVar4) {
                *(ulong *)*pauVar24 = uVar28;
                *(uint *)((long)*pauVar24 + 8) = uVar4;
                pauVar24 = pauVar24 + 1;
              }
              else {
                *(ulong *)*pauVar24 = uVar29;
                *(uint *)((long)*pauVar24 + 8) = uVar3;
                pauVar24 = pauVar24 + 1;
                uVar29 = uVar28;
              }
            }
            else {
              auVar49._8_8_ = 0;
              auVar49._0_8_ = uVar29;
              auVar34 = vpunpcklqdq_avx(auVar49,ZEXT416(uVar3));
              auVar50._8_8_ = 0;
              auVar50._0_8_ = uVar28;
              auVar32 = vpunpcklqdq_avx(auVar50,ZEXT416(uVar4));
              lVar26 = 0;
              for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                lVar26 = lVar26 + 1;
              }
              uVar22 = uVar22 - 1 & uVar22;
              uVar29 = (ulong)uVar22;
              auVar51._8_8_ = 0;
              auVar51._0_8_ = *(ulong *)(uVar25 + lVar26 * 8);
              auVar50 = vpunpcklqdq_avx(auVar51,ZEXT416(*(uint *)(local_1058 + lVar26 * 4)));
              auVar52 = vpshufd_avx(auVar34,0xaa);
              auVar30 = vpshufd_avx(auVar32,0xaa);
              auVar49 = vpshufd_avx(auVar50,0xaa);
              if (uVar22 == 0) {
                uVar29 = vpcmpgtd_avx512vl(auVar30,auVar52);
                uVar29 = uVar29 & 0xf;
                auVar30 = vpblendmd_avx512vl(auVar32,auVar34);
                bVar19 = (bool)((byte)uVar29 & 1);
                auVar31._0_4_ = (uint)bVar19 * auVar30._0_4_ | (uint)!bVar19 * auVar52._0_4_;
                bVar19 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar31._4_4_ = (uint)bVar19 * auVar30._4_4_ | (uint)!bVar19 * auVar52._4_4_;
                bVar19 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar31._8_4_ = (uint)bVar19 * auVar30._8_4_ | (uint)!bVar19 * auVar52._8_4_;
                bVar19 = SUB81(uVar29 >> 3,0);
                auVar31._12_4_ = (uint)bVar19 * auVar30._12_4_ | (uint)!bVar19 * auVar52._12_4_;
                auVar32 = vmovdqa32_avx512vl(auVar32);
                bVar19 = (bool)((byte)uVar29 & 1);
                auVar33._0_4_ = (uint)bVar19 * auVar32._0_4_ | (uint)!bVar19 * auVar34._0_4_;
                bVar19 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar33._4_4_ = (uint)bVar19 * auVar32._4_4_ | (uint)!bVar19 * auVar34._4_4_;
                bVar19 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar33._8_4_ = (uint)bVar19 * auVar32._8_4_ | (uint)!bVar19 * auVar34._8_4_;
                bVar19 = SUB81(uVar29 >> 3,0);
                auVar33._12_4_ = (uint)bVar19 * auVar32._12_4_ | (uint)!bVar19 * auVar34._12_4_;
                auVar34 = vpshufd_avx(auVar31,0xaa);
                uVar28 = vpcmpgtd_avx512vl(auVar49,auVar34);
                uVar28 = uVar28 & 0xf;
                auVar32 = vpblendmd_avx512vl(auVar50,auVar31);
                bVar19 = (bool)((byte)uVar28 & 1);
                bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
                uVar29 = CONCAT44((uint)bVar5 * auVar32._4_4_ | (uint)!bVar5 * auVar34._4_4_,
                                  (uint)bVar19 * auVar32._0_4_ | (uint)!bVar19 * auVar34._0_4_);
                auVar34 = vmovdqa32_avx512vl(auVar50);
                bVar19 = (bool)((byte)uVar28 & 1);
                auVar35._0_4_ = (uint)bVar19 * auVar34._0_4_ | !bVar19 * auVar31._0_4_;
                bVar19 = (bool)((byte)(uVar28 >> 1) & 1);
                auVar35._4_4_ = (uint)bVar19 * auVar34._4_4_ | !bVar19 * auVar31._4_4_;
                bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                auVar35._8_4_ = (uint)bVar19 * auVar34._8_4_ | !bVar19 * auVar31._8_4_;
                bVar19 = SUB81(uVar28 >> 3,0);
                auVar35._12_4_ = (uint)bVar19 * auVar34._12_4_ | !bVar19 * auVar31._12_4_;
                auVar34 = vpshufd_avx(auVar35,0xaa);
                auVar32 = vpshufd_avx(auVar33,0xaa);
                uVar28 = vpcmpgtd_avx512vl(auVar34,auVar32);
                uVar28 = uVar28 & 0xf;
                auVar32 = vpblendmd_avx512vl(auVar35,auVar33);
                bVar19 = (bool)((byte)uVar28 & 1);
                auVar36._0_4_ = (uint)bVar19 * auVar32._0_4_ | (uint)!bVar19 * auVar34._0_4_;
                bVar19 = (bool)((byte)(uVar28 >> 1) & 1);
                auVar36._4_4_ = (uint)bVar19 * auVar32._4_4_ | (uint)!bVar19 * auVar34._4_4_;
                bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                auVar36._8_4_ = (uint)bVar19 * auVar32._8_4_ | (uint)!bVar19 * auVar34._8_4_;
                bVar19 = SUB81(uVar28 >> 3,0);
                auVar36._12_4_ = (uint)bVar19 * auVar32._12_4_ | (uint)!bVar19 * auVar34._12_4_;
                auVar34 = vmovdqa32_avx512vl(auVar35);
                bVar19 = (bool)((byte)uVar28 & 1);
                auVar37._0_4_ = (uint)bVar19 * auVar34._0_4_ | !bVar19 * auVar33._0_4_;
                bVar19 = (bool)((byte)(uVar28 >> 1) & 1);
                auVar37._4_4_ = (uint)bVar19 * auVar34._4_4_ | !bVar19 * auVar33._4_4_;
                bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                auVar37._8_4_ = (uint)bVar19 * auVar34._8_4_ | !bVar19 * auVar33._8_4_;
                bVar19 = SUB81(uVar28 >> 3,0);
                auVar37._12_4_ = (uint)bVar19 * auVar34._12_4_ | !bVar19 * auVar33._12_4_;
                *pauVar24 = auVar37;
                pauVar24[1] = auVar36;
                pauVar24 = pauVar24 + 2;
              }
              else {
                lVar26 = 0;
                for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                  lVar26 = lVar26 + 1;
                }
                uVar22 = *(uint *)(local_1058 + lVar26 * 4);
                auVar54._8_8_ = 0;
                auVar54._0_8_ = *(ulong *)(uVar25 + lVar26 * 8);
                auVar51 = vpunpcklqdq_avx(auVar54,ZEXT416(uVar22));
                uVar29 = vpcmpgtd_avx512vl(auVar30,auVar52);
                uVar29 = uVar29 & 0xf;
                auVar30 = vpblendmd_avx512vl(auVar32,auVar34);
                bVar19 = (bool)((byte)uVar29 & 1);
                auVar38._0_4_ = (uint)bVar19 * auVar30._0_4_ | (uint)!bVar19 * auVar52._0_4_;
                bVar19 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar38._4_4_ = (uint)bVar19 * auVar30._4_4_ | (uint)!bVar19 * auVar52._4_4_;
                bVar19 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar38._8_4_ = (uint)bVar19 * auVar30._8_4_ | (uint)!bVar19 * auVar52._8_4_;
                bVar19 = SUB81(uVar29 >> 3,0);
                auVar38._12_4_ = (uint)bVar19 * auVar30._12_4_ | (uint)!bVar19 * auVar52._12_4_;
                auVar32 = vmovdqa32_avx512vl(auVar32);
                bVar19 = (bool)((byte)uVar29 & 1);
                auVar39._0_4_ = (uint)bVar19 * auVar32._0_4_ | (uint)!bVar19 * auVar34._0_4_;
                bVar19 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar39._4_4_ = (uint)bVar19 * auVar32._4_4_ | (uint)!bVar19 * auVar34._4_4_;
                bVar19 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar39._8_4_ = (uint)bVar19 * auVar32._8_4_ | (uint)!bVar19 * auVar34._8_4_;
                bVar19 = SUB81(uVar29 >> 3,0);
                auVar39._12_4_ = (uint)bVar19 * auVar32._12_4_ | (uint)!bVar19 * auVar34._12_4_;
                auVar53._4_4_ = uVar22;
                auVar53._0_4_ = uVar22;
                auVar53._8_4_ = uVar22;
                auVar53._12_4_ = uVar22;
                uVar29 = vpcmpgtd_avx512vl(auVar53,auVar49);
                uVar29 = uVar29 & 0xf;
                auVar34 = vpblendmd_avx512vl(auVar51,auVar50);
                bVar19 = (bool)((byte)uVar29 & 1);
                auVar40._0_4_ = (uint)bVar19 * auVar34._0_4_ | !bVar19 * uVar22;
                bVar19 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar40._4_4_ = (uint)bVar19 * auVar34._4_4_ | !bVar19 * uVar22;
                bVar19 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar40._8_4_ = (uint)bVar19 * auVar34._8_4_ | !bVar19 * uVar22;
                bVar19 = SUB81(uVar29 >> 3,0);
                auVar40._12_4_ = (uint)bVar19 * auVar34._12_4_ | !bVar19 * uVar22;
                auVar34 = vmovdqa32_avx512vl(auVar51);
                bVar19 = (bool)((byte)uVar29 & 1);
                auVar41._0_4_ = (uint)bVar19 * auVar34._0_4_ | (uint)!bVar19 * auVar50._0_4_;
                bVar19 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar41._4_4_ = (uint)bVar19 * auVar34._4_4_ | (uint)!bVar19 * auVar50._4_4_;
                bVar19 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar41._8_4_ = (uint)bVar19 * auVar34._8_4_ | (uint)!bVar19 * auVar50._8_4_;
                bVar19 = SUB81(uVar29 >> 3,0);
                auVar41._12_4_ = (uint)bVar19 * auVar34._12_4_ | (uint)!bVar19 * auVar50._12_4_;
                auVar34 = vpshufd_avx(auVar41,0xaa);
                auVar32 = vpshufd_avx(auVar39,0xaa);
                uVar29 = vpcmpgtd_avx512vl(auVar34,auVar32);
                uVar29 = uVar29 & 0xf;
                auVar32 = vpblendmd_avx512vl(auVar41,auVar39);
                bVar19 = (bool)((byte)uVar29 & 1);
                auVar42._0_4_ = (uint)bVar19 * auVar32._0_4_ | (uint)!bVar19 * auVar34._0_4_;
                bVar19 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar42._4_4_ = (uint)bVar19 * auVar32._4_4_ | (uint)!bVar19 * auVar34._4_4_;
                bVar19 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar42._8_4_ = (uint)bVar19 * auVar32._8_4_ | (uint)!bVar19 * auVar34._8_4_;
                bVar19 = SUB81(uVar29 >> 3,0);
                auVar42._12_4_ = (uint)bVar19 * auVar32._12_4_ | (uint)!bVar19 * auVar34._12_4_;
                auVar34 = vmovdqa32_avx512vl(auVar41);
                bVar19 = (bool)((byte)uVar29 & 1);
                auVar43._0_4_ = (uint)bVar19 * auVar34._0_4_ | !bVar19 * auVar39._0_4_;
                bVar19 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar43._4_4_ = (uint)bVar19 * auVar34._4_4_ | !bVar19 * auVar39._4_4_;
                bVar19 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar43._8_4_ = (uint)bVar19 * auVar34._8_4_ | !bVar19 * auVar39._8_4_;
                bVar19 = SUB81(uVar29 >> 3,0);
                auVar43._12_4_ = (uint)bVar19 * auVar34._12_4_ | !bVar19 * auVar39._12_4_;
                auVar34 = vpshufd_avx(auVar40,0xaa);
                auVar32 = vpshufd_avx(auVar38,0xaa);
                uVar28 = vpcmpgtd_avx512vl(auVar34,auVar32);
                uVar28 = uVar28 & 0xf;
                auVar32 = vpblendmd_avx512vl(auVar40,auVar38);
                bVar19 = (bool)((byte)uVar28 & 1);
                bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
                uVar29 = CONCAT44((uint)bVar5 * auVar32._4_4_ | (uint)!bVar5 * auVar34._4_4_,
                                  (uint)bVar19 * auVar32._0_4_ | (uint)!bVar19 * auVar34._0_4_);
                auVar34 = vmovdqa32_avx512vl(auVar40);
                bVar19 = (bool)((byte)uVar28 & 1);
                auVar44._0_4_ = (uint)bVar19 * auVar34._0_4_ | !bVar19 * auVar38._0_4_;
                bVar19 = (bool)((byte)(uVar28 >> 1) & 1);
                auVar44._4_4_ = (uint)bVar19 * auVar34._4_4_ | !bVar19 * auVar38._4_4_;
                bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                auVar44._8_4_ = (uint)bVar19 * auVar34._8_4_ | !bVar19 * auVar38._8_4_;
                bVar19 = SUB81(uVar28 >> 3,0);
                auVar44._12_4_ = (uint)bVar19 * auVar34._12_4_ | !bVar19 * auVar38._12_4_;
                auVar34 = vpshufd_avx(auVar44,0xaa);
                auVar32 = vpshufd_avx(auVar42,0xaa);
                uVar28 = vpcmpgtd_avx512vl(auVar32,auVar34);
                uVar28 = uVar28 & 0xf;
                auVar32 = vpblendmd_avx512vl(auVar42,auVar44);
                bVar19 = (bool)((byte)uVar28 & 1);
                auVar45._0_4_ = (uint)bVar19 * auVar32._0_4_ | (uint)!bVar19 * auVar34._0_4_;
                bVar19 = (bool)((byte)(uVar28 >> 1) & 1);
                auVar45._4_4_ = (uint)bVar19 * auVar32._4_4_ | (uint)!bVar19 * auVar34._4_4_;
                bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                auVar45._8_4_ = (uint)bVar19 * auVar32._8_4_ | (uint)!bVar19 * auVar34._8_4_;
                bVar19 = SUB81(uVar28 >> 3,0);
                auVar45._12_4_ = (uint)bVar19 * auVar32._12_4_ | (uint)!bVar19 * auVar34._12_4_;
                auVar34 = vmovdqa32_avx512vl(auVar42);
                bVar19 = (bool)((byte)uVar28 & 1);
                auVar46._0_4_ = (uint)bVar19 * auVar34._0_4_ | !bVar19 * auVar44._0_4_;
                bVar19 = (bool)((byte)(uVar28 >> 1) & 1);
                auVar46._4_4_ = (uint)bVar19 * auVar34._4_4_ | !bVar19 * auVar44._4_4_;
                bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
                auVar46._8_4_ = (uint)bVar19 * auVar34._8_4_ | !bVar19 * auVar44._8_4_;
                bVar19 = SUB81(uVar28 >> 3,0);
                auVar46._12_4_ = (uint)bVar19 * auVar34._12_4_ | !bVar19 * auVar44._12_4_;
                *pauVar24 = auVar43;
                pauVar24[1] = auVar46;
                pauVar24[2] = auVar45;
                pauVar24 = pauVar24 + 3;
              }
            }
          }
          goto LAB_01bdcf3a;
        }
        goto LAB_01bdcf1a;
      }
      if ((uVar29 & 8) == 0) {
        uVar21 = uVar29 & 0xfffffffffffffff0;
        fVar6 = query->time;
        auVar47._4_4_ = fVar6;
        auVar47._0_4_ = fVar6;
        auVar47._8_4_ = fVar6;
        auVar47._12_4_ = fVar6;
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x80),auVar47,
                                  *(undefined1 (*) [16])(uVar21 + 0x20));
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xa0),auVar47,
                                  *(undefined1 (*) [16])(uVar21 + 0x40));
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xc0),auVar47,
                                  *(undefined1 (*) [16])(uVar21 + 0x60));
        auVar17 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x90),auVar47,
                                  *(undefined1 (*) [16])(uVar21 + 0x30));
        auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xb0),auVar47,
                                  *(undefined1 (*) [16])(uVar21 + 0x50));
        auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xd0),auVar47,
                                  *(undefined1 (*) [16])(uVar21 + 0x70));
        auVar30 = vmaxps_avx(auVar34,auVar49);
        auVar30 = vminps_avx(auVar30,auVar17);
        auVar30 = vsubps_avx(auVar30,auVar34);
        auVar34 = vmaxps_avx(auVar32,auVar50);
        auVar34 = vminps_avx(auVar34,auVar38);
        auVar32 = vsubps_avx(auVar34,auVar32);
        auVar34 = vmaxps_avx(auVar52,auVar51);
        auVar34 = vminps_avx(auVar34,auVar39);
        auVar34 = vsubps_avx(auVar34,auVar52);
        local_1058._0_4_ =
             auVar30._0_4_ * auVar30._0_4_ + auVar32._0_4_ * auVar32._0_4_ +
             auVar34._0_4_ * auVar34._0_4_;
        local_1058._4_4_ =
             auVar30._4_4_ * auVar30._4_4_ + auVar32._4_4_ * auVar32._4_4_ +
             auVar34._4_4_ * auVar34._4_4_;
        fStack_1050 = auVar30._8_4_ * auVar30._8_4_ + auVar32._8_4_ * auVar32._8_4_ +
                      auVar34._8_4_ * auVar34._8_4_;
        fStack_104c = auVar30._12_4_ * auVar30._12_4_ + auVar32._12_4_ * auVar32._12_4_ +
                      auVar34._12_4_ * auVar34._12_4_;
        uVar28 = vcmpps_avx512vl(_local_1058,auVar58._0_16_,2);
        uVar25 = vcmpps_avx512vl(auVar49,auVar17,2);
        uVar28 = uVar28 & uVar25;
        if ((uVar22 & 7) == 6) {
          uVar15 = vcmpps_avx512vl(auVar47,*(undefined1 (*) [16])(uVar21 + 0xf0),1);
          uVar16 = vcmpps_avx512vl(auVar47,*(undefined1 (*) [16])(uVar21 + 0xe0),0xd);
          uVar28 = (ulong)(byte)((byte)uVar15 & (byte)uVar16 & (byte)uVar28);
        }
        goto LAB_01bdd011;
      }
LAB_01bdd389:
      local_1030 = (ulong)(uVar22 & 0xf) - 8;
      lVar26 = (uVar29 & 0xfffffffffffffff0) + 0x40;
      local_1020 = 0;
      for (local_1028 = 0; local_1028 != local_1030; local_1028 = local_1028 + 1) {
        bVar23 = 0;
        for (lVar27 = 0; (lVar27 != 4 && (*(int *)(lVar26 + lVar27 * 4) != -1)); lVar27 = lVar27 + 1
            ) {
          uVar22 = *(uint *)(lVar26 + -0x10 + lVar27 * 4);
          this = (context->scene->geometries).items[uVar22].ptr;
          context->geomID = uVar22;
          context->primID = *(uint *)(lVar26 + lVar27 * 4);
          bVar19 = Geometry::pointQuery(this,query,context);
          auVar58 = ZEXT1664(local_f88);
          auVar57 = ZEXT1664(local_fb8);
          auVar56 = ZEXT1664(local_fa8);
          auVar55 = ZEXT1664(local_f98);
          bVar23 = bVar23 | bVar19;
        }
        local_1020 = CONCAT71((int7)(local_1020 >> 8),(byte)local_1020 | bVar23);
        lVar26 = lVar26 + 0x50;
      }
    } while ((local_1020 & 1) == 0);
    uVar1 = *(undefined4 *)&(context->query_radius).field_0;
    auVar34._4_4_ = uVar1;
    auVar34._0_4_ = uVar1;
    auVar34._8_4_ = uVar1;
    auVar34._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar32._4_4_ = uVar1;
    auVar32._0_4_ = uVar1;
    auVar32._8_4_ = uVar1;
    auVar32._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar52._4_4_ = uVar1;
    auVar52._0_4_ = uVar1;
    auVar52._8_4_ = uVar1;
    auVar52._12_4_ = uVar1;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_1048 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      local_1048 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    }
    bVar20 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }